

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCompoundCollisionAlgorithm.cpp
# Opt level: O1

void __thiscall
cbtCompoundLeafCallback::ProcessChildShape
          (cbtCompoundLeafCallback *this,cbtCollisionShape *childShape,int index)

{
  cbtScalar cVar1;
  float fVar2;
  cbtScalar cVar3;
  cbtScalar cVar4;
  float fVar5;
  cbtScalar cVar6;
  cbtScalar cVar7;
  float fVar8;
  cbtScalar cVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  cbtCollisionShape *pcVar19;
  cbtTransform *pcVar20;
  void *pvVar21;
  cbtManifoldResult *pcVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  byte bVar27;
  byte bVar28;
  bool bVar29;
  int iVar30;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar32;
  long lVar33;
  cbtCollisionObjectWrapper *pcVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  cbtVector3 aabbMin1;
  cbtVector3 aabbMax0;
  cbtCollisionObjectWrapper compoundWrap;
  cbtVector3 aabbMax1;
  cbtVector3 aabbMin0;
  cbtTransform newChildWorldTrans;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_c8;
  float local_c4;
  float local_c0;
  cbtCollisionObjectWrapper *local_b8;
  cbtCollisionShape *local_b0;
  cbtCollisionObject *local_a8;
  undefined4 *local_a0;
  undefined4 local_98;
  int local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_80;
  float local_7c;
  float local_78;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 local_40 [16];
  cbtCollisionAlgorithm *pcVar31;
  
  pcVar19 = this->m_compoundColObjWrap->m_shape;
  if ((gCompoundChildShapePairCallback != (cbtShapePairCallback)0x0) &&
     (bVar29 = (*gCompoundChildShapePairCallback)(this->m_otherObjWrap->m_shape,childShape), !bVar29
     )) {
    return;
  }
  pcVar20 = this->m_compoundColObjWrap->m_worldTransform;
  cVar1 = (pcVar20->m_basis).m_el[0].m_floats[0];
  fVar2 = (pcVar20->m_basis).m_el[0].m_floats[1];
  cVar3 = (pcVar20->m_basis).m_el[0].m_floats[2];
  cVar4 = (pcVar20->m_basis).m_el[1].m_floats[0];
  fVar5 = (pcVar20->m_basis).m_el[1].m_floats[1];
  cVar6 = (pcVar20->m_basis).m_el[1].m_floats[2];
  cVar7 = (pcVar20->m_basis).m_el[2].m_floats[0];
  fVar8 = (pcVar20->m_basis).m_el[2].m_floats[1];
  cVar9 = (pcVar20->m_basis).m_el[2].m_floats[2];
  pvVar21 = pcVar19[1].m_userPointer;
  lVar33 = (long)index;
  lVar32 = lVar33 * 0x58;
  fVar10 = *(float *)((long)pvVar21 + lVar32 + 0x10);
  uVar11 = *(uint *)((long)pvVar21 + lVar32);
  uVar12 = *(uint *)((long)pvVar21 + lVar32 + 4);
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar1));
  uVar13 = *(uint *)((long)pvVar21 + lVar32 + 0x20);
  auVar23 = vfmadd231ss_fma(auVar36,ZEXT416(uVar13),ZEXT416((uint)cVar3));
  fVar14 = *(float *)((long)pvVar21 + lVar32 + 0x14);
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar14)),ZEXT416(uVar12),ZEXT416((uint)cVar1));
  uVar15 = *(uint *)((long)pvVar21 + lVar32 + 0x24);
  auVar35 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar15),ZEXT416((uint)cVar3));
  uVar16 = *(uint *)((long)pvVar21 + lVar32 + 8);
  uVar17 = *(uint *)((long)pvVar21 + lVar32 + 0x18);
  auVar36 = vmulss_avx512f(ZEXT416((uint)fVar2),ZEXT416(uVar17));
  auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar16),ZEXT416((uint)cVar1));
  uVar18 = *(uint *)((long)pvVar21 + lVar32 + 0x28);
  auVar37 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar18),ZEXT416((uint)cVar3));
  auVar36 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar10));
  auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar11),ZEXT416((uint)cVar4));
  auVar38 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar13),ZEXT416((uint)cVar6));
  auVar36 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)fVar14));
  auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar12),ZEXT416((uint)cVar4));
  auVar39 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar15),ZEXT416((uint)cVar6));
  auVar36 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416(uVar17));
  auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar16),ZEXT416((uint)cVar4));
  auVar40 = vfmadd231ss_avx512f(auVar36,ZEXT416(uVar18),ZEXT416((uint)cVar6));
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416((uint)cVar7),ZEXT416(uVar11));
  auVar24 = vfmadd231ss_fma(auVar36,ZEXT416((uint)cVar9),ZEXT416(uVar13));
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar14 * fVar8)),ZEXT416((uint)cVar7),ZEXT416(uVar12));
  auVar41 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar9),ZEXT416(uVar15));
  auVar36 = vmulss_avx512f(ZEXT416((uint)fVar8),ZEXT416(uVar17));
  auVar36 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar7),ZEXT416(uVar16));
  auVar42 = vfmadd231ss_avx512f(auVar36,ZEXT416((uint)cVar9),ZEXT416(uVar18));
  uVar11 = *(uint *)((long)pvVar21 + lVar32 + 0x30);
  fVar10 = *(float *)((long)pvVar21 + lVar32 + 0x34);
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar1));
  uVar12 = *(uint *)((long)pvVar21 + lVar32 + 0x38);
  auVar36 = vfmadd231ss_fma(auVar36,ZEXT416(uVar12),ZEXT416((uint)cVar3));
  auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar10)),ZEXT416(uVar11),ZEXT416((uint)cVar4));
  auVar25 = vfmadd231ss_fma(auVar25,ZEXT416(uVar12),ZEXT416((uint)cVar6));
  auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar8)),ZEXT416(uVar11),ZEXT416((uint)cVar7));
  auVar26 = vfmadd231ss_fma(auVar26,ZEXT416(uVar12),ZEXT416((uint)cVar9));
  auVar36 = vinsertps_avx(ZEXT416((uint)(auVar36._0_4_ + (pcVar20->m_origin).m_floats[0])),
                          ZEXT416((uint)(auVar25._0_4_ + (pcVar20->m_origin).m_floats[1])),0x10);
  local_40 = vinsertps_avx(auVar36,ZEXT416((uint)(auVar26._0_4_ + (pcVar20->m_origin).m_floats[2])),
                           0x28);
  local_70 = auVar23._0_4_;
  local_6c = auVar35._0_4_;
  local_68 = auVar37._0_4_;
  local_64 = 0;
  local_60 = auVar38._0_4_;
  local_5c = auVar39._0_4_;
  local_58 = auVar40._0_4_;
  local_54 = 0;
  local_50 = auVar24._0_4_;
  local_4c = auVar41._0_4_;
  local_48 = auVar42._0_4_;
  local_44 = 0;
  (*childShape->_vptr_cbtCollisionShape[2])(childShape,&local_70,&local_80,&local_c8);
  fVar2 = this->m_resultOut->m_closestPointDistanceThreshold;
  local_80 = local_80 - fVar2;
  local_7c = local_7c - fVar2;
  local_78 = local_78 - fVar2;
  local_c8 = fVar2 + local_c8;
  local_c4 = fVar2 + local_c4;
  local_c0 = fVar2 + local_c0;
  pcVar19 = this->m_otherObjWrap->m_shape;
  (*pcVar19->_vptr_cbtCollisionShape[2])
            (pcVar19,this->m_otherObjWrap->m_worldTransform,&local_d8,&local_90);
  bVar28 = 1;
  if ((local_80 <= local_90) && (bVar28 = 1, local_d8 <= local_c8)) {
    bVar28 = 0;
  }
  bVar27 = 1;
  if ((local_78 <= local_88) && (local_d0 <= local_c0)) {
    bVar27 = bVar28;
  }
  if ((local_7c <= local_8c) && (!(bool)(bVar27 | local_c4 < local_d4))) {
    local_b8 = this->m_compoundColObjWrap;
    local_a8 = local_b8->m_collisionObject;
    local_98 = 0xffffffff;
    fVar2 = this->m_resultOut->m_closestPointDistanceThreshold;
    local_b0 = childShape;
    local_a0 = &local_70;
    local_94 = index;
    if (fVar2 <= 0.0) {
      if (this->m_childCollisionAlgorithms[lVar33] == (cbtCollisionAlgorithm *)0x0) {
        iVar30 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                           (this->m_dispatcher,&local_b8,this->m_otherObjWrap,this->m_sharedManifold
                            ,1);
        this->m_childCollisionAlgorithms[lVar33] =
             (cbtCollisionAlgorithm *)CONCAT44(extraout_var_00,iVar30);
      }
      pcVar31 = this->m_childCollisionAlgorithms[lVar33];
    }
    else {
      iVar30 = (*this->m_dispatcher->_vptr_cbtDispatcher[2])
                         (this->m_dispatcher,&local_b8,this->m_otherObjWrap,0,2);
      pcVar31 = (cbtCollisionAlgorithm *)CONCAT44(extraout_var,iVar30);
    }
    pcVar22 = this->m_resultOut;
    pcVar34 = pcVar22->m_body0Wrap;
    if (pcVar34->m_collisionObject == this->m_compoundColObjWrap->m_collisionObject) {
      lVar32 = 0x10;
    }
    else {
      pcVar34 = pcVar22->m_body1Wrap;
      lVar32 = 0x18;
    }
    *(cbtCollisionObjectWrapper ***)((long)&(pcVar22->super_Result)._vptr_Result + lVar32) =
         &local_b8;
    (**(code **)((long)(pcVar22->super_Result)._vptr_Result + lVar32))(pcVar22,0xffffffff,index);
    (*pcVar31->_vptr_cbtCollisionAlgorithm[2])
              (pcVar31,&local_b8,this->m_otherObjWrap,this->m_dispatchInfo,this->m_resultOut);
    (&this->m_resultOut->m_body0Wrap)
    [this->m_resultOut->m_body0Wrap->m_collisionObject !=
     this->m_compoundColObjWrap->m_collisionObject] = pcVar34;
    if (0.0 < fVar2) {
      (**pcVar31->_vptr_cbtCollisionAlgorithm)(pcVar31);
      (*this->m_dispatcher->_vptr_cbtDispatcher[0xf])(this->m_dispatcher,pcVar31);
    }
  }
  return;
}

Assistant:

void ProcessChildShape(const cbtCollisionShape* childShape, int index)
	{
		cbtAssert(index >= 0);
		const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(m_compoundColObjWrap->getCollisionShape());
		cbtAssert(index < compoundShape->getNumChildShapes());

		if (gCompoundChildShapePairCallback)
		{
			if (!gCompoundChildShapePairCallback(m_otherObjWrap->getCollisionShape(), childShape))
				return;
		}

		//backup
		cbtTransform orgTrans = m_compoundColObjWrap->getWorldTransform();

		const cbtTransform& childTrans = compoundShape->getChildTransform(index);
		cbtTransform newChildWorldTrans = orgTrans * childTrans;

		//perform an AABB check first
		cbtVector3 aabbMin0, aabbMax0;
		childShape->getAabb(newChildWorldTrans, aabbMin0, aabbMax0);

		cbtVector3 extendAabb(m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold, m_resultOut->m_closestPointDistanceThreshold);
		aabbMin0 -= extendAabb;
		aabbMax0 += extendAabb;

		cbtVector3 aabbMin1, aabbMax1;
		m_otherObjWrap->getCollisionShape()->getAabb(m_otherObjWrap->getWorldTransform(), aabbMin1, aabbMax1);


		if (TestAabbAgainstAabb2(aabbMin0, aabbMax0, aabbMin1, aabbMax1))
		{
			cbtCollisionObjectWrapper compoundWrap(this->m_compoundColObjWrap, childShape, m_compoundColObjWrap->getCollisionObject(), newChildWorldTrans, -1, index);

			cbtCollisionAlgorithm* algo = 0;
			bool allocatedAlgorithm = false;

			if (m_resultOut->m_closestPointDistanceThreshold > 0)
			{
				algo = m_dispatcher->findAlgorithm(&compoundWrap, m_otherObjWrap, 0, BT_CLOSEST_POINT_ALGORITHMS);
				allocatedAlgorithm = true;
			}
			else
			{
				//the contactpoint is still projected back using the original inverted worldtrans
				if (!m_childCollisionAlgorithms[index])
				{
					m_childCollisionAlgorithms[index] = m_dispatcher->findAlgorithm(&compoundWrap, m_otherObjWrap, m_sharedManifold, BT_CONTACT_POINT_ALGORITHMS);
				}
				algo = m_childCollisionAlgorithms[index];
			}

			const cbtCollisionObjectWrapper* tmpWrap = 0;

			///detect swapping case
			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				tmpWrap = m_resultOut->getBody0Wrap();
				m_resultOut->setBody0Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersA(-1, index);
			}
			else
			{
				tmpWrap = m_resultOut->getBody1Wrap();
				m_resultOut->setBody1Wrap(&compoundWrap);
				m_resultOut->setShapeIdentifiersB(-1, index);
			}

			algo->processCollision(&compoundWrap, m_otherObjWrap, m_dispatchInfo, m_resultOut);

#if 0
			if (m_dispatchInfo.m_debugDraw && (m_dispatchInfo.m_debugDraw->getDebugMode() & cbtIDebugDraw::DBG_DrawAabb))
			{
				cbtVector3 worldAabbMin,worldAabbMax;
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin0,aabbMax0,cbtVector3(1,1,1));
				m_dispatchInfo.m_debugDraw->drawAabb(aabbMin1,aabbMax1,cbtVector3(1,1,1));
			}
#endif

			if (m_resultOut->getBody0Internal() == m_compoundColObjWrap->getCollisionObject())
			{
				m_resultOut->setBody0Wrap(tmpWrap);
			}
			else
			{
				m_resultOut->setBody1Wrap(tmpWrap);
			}
			if (allocatedAlgorithm)
			{
				algo->~cbtCollisionAlgorithm();
				m_dispatcher->freeCollisionAlgorithm(algo);
			}
		}
	}